

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_casting.hpp
# Opt level: O2

bool duckdb::CSVCast::
     TemplatedTryCastFloatingVector<duckdb::TryCastErrorMessageCommaSeparated,float>
               (CSVReaderOptions *options,Vector *input_vector,Vector *result_vector,idx_t count,
               CastParameters *parameters,idx_t *line_error)

{
  bool all_converted;
  idx_t row;
  CastParameters *local_28;
  idx_t *local_20;
  idx_t *local_18;
  bool *local_10;
  
  local_10 = &all_converted;
  all_converted = true;
  local_18 = &row;
  row = 0;
  local_28 = parameters;
  local_20 = line_error;
  UnaryExecutor::
  ExecuteStandard<duckdb::string_t,float,duckdb::UnaryLambdaWrapper,duckdb::CSVCast::TemplatedTryCastFloatingVector<duckdb::TryCastErrorMessageCommaSeparated,float>(duckdb::CSVReaderOptions_const&,duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&,unsigned_long&)::_lambda(duckdb::string_t)_1_>
            (input_vector,result_vector,count,&local_28,false,CAN_THROW_RUNTIME_ERROR);
  return all_converted;
}

Assistant:

static bool TemplatedTryCastFloatingVector(const CSVReaderOptions &options, Vector &input_vector,
	                                           Vector &result_vector, idx_t count, CastParameters &parameters,
	                                           idx_t &line_error) {
		D_ASSERT(input_vector.GetType().id() == LogicalTypeId::VARCHAR);
		bool all_converted = true;
		idx_t row = 0;
		UnaryExecutor::Execute<string_t, T>(input_vector, result_vector, count, [&](string_t input) {
			T result;
			if (!OP::Operation(input, result, parameters)) {
				line_error = row;
				all_converted = false;
			} else {
				row++;
			}
			return result;
		});
		return all_converted;
	}